

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

bool Diligent::BasicFileSystem::IsPathAbsolute(Char *strPath)

{
  Char *strPath_local;
  
  if ((strPath == (Char *)0x0) || (*strPath == '\0')) {
    strPath_local._7_1_ = false;
  }
  else {
    strPath_local._7_1_ = *strPath == '/';
  }
  return strPath_local._7_1_;
}

Assistant:

bool BasicFileSystem::IsPathAbsolute(const Char* strPath)
{
    if (strPath == nullptr || strPath[0] == 0)
        return false;

#if PLATFORM_WIN32 || PLATFORM_UNIVERSAL_WINDOWS
    return ((strPath[1] == ':' && (strPath[2] == '\\' || strPath[2] == '/')) || // c:\Path or c:/Path
            (strPath[0] == '\\' && strPath[1] == '\\'));                        // \\?\Path
#elif PLATFORM_LINUX || PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS || PLATFORM_ANDROID || PLATFORM_WEB
    return strPath[0] == '/';
#else
#    error Unknown platform.
#endif
}